

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O3

bool __thiscall xray_re::xr_ini_file::section_exist(xr_ini_file *this,char *sname)

{
  pointer ppiVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  pointer ppiVar5;
  bool bVar6;
  
  ppiVar5 = (this->m_sections).
            super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppiVar1 = (this->m_sections).
            super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)ppiVar1 - (long)ppiVar5 >> 3;
  while (uVar2 = uVar4, 0 < (long)uVar2) {
    uVar4 = uVar2 >> 1;
    iVar3 = strcasecmp((ppiVar5[uVar4]->name)._M_dataplus._M_p,sname);
    if (iVar3 < 0) {
      ppiVar5 = ppiVar5 + uVar4 + 1;
      uVar4 = ~uVar4 + uVar2;
    }
  }
  if (ppiVar5 == ppiVar1) {
    bVar6 = false;
  }
  else {
    iVar3 = strcasecmp(((*ppiVar5)->name)._M_dataplus._M_p,sname);
    bVar6 = iVar3 == 0;
  }
  return bVar6;
}

Assistant:

bool xr_ini_file::section_exist(const char* sname) const
{
	ini_section_vec_cit it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(sname));
	return it != m_sections.end() && xr_stricmp((*it)->name.c_str(), sname) == 0;
}